

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O0

Var Js::AtomicsObject::ValidateSharedIntegerTypedArray
              (Var typedArray,ScriptContext *scriptContext,bool onlyInt32)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  TypedArrayBase *this_00;
  ArrayBufferBase *obj;
  ArrayBufferBase *arrayBuffer;
  TypedArrayBase *typedArrayBase;
  TypeId typeId;
  bool onlyInt32_local;
  ScriptContext *scriptContext_local;
  Var typedArray_local;
  TypeId local_18;
  TypeId typeId_1;
  
  bVar2 = VarIs<Js::TypedArrayBase>(typedArray);
  if (!bVar2) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e9e2,(PCWSTR)0x0);
  }
  if (typedArray == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(typedArray);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(typedArray);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      this = UnsafeVarTo<Js::RecyclableObject>(typedArray);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(this);
      if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  if (onlyInt32) {
    if (local_18 != TypeIds_Int32Array) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e9e0,(PCWSTR)0x0);
    }
  }
  else if (((((local_18 != TypeIds_Int8Array) && (local_18 != TypeIds_Uint8Array)) &&
            (local_18 != TypeIds_Int16Array)) &&
           ((local_18 != TypeIds_Uint16Array && (local_18 != TypeIds_Int32Array)))) &&
          (local_18 != TypeIds_Uint32Array)) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e9e0,(PCWSTR)0x0);
  }
  this_00 = UnsafeVarTo<Js::TypedArrayBase>(typedArray);
  obj = ArrayBufferParent::GetArrayBuffer(&this_00->super_ArrayBufferParent);
  if (((obj != (ArrayBufferBase *)0x0) &&
      (bVar2 = VarIsCorrectType<Js::ArrayBufferBase>(obj), bVar2)) &&
     (uVar4 = (*(obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c])(), (uVar4 & 1) != 0
     )) {
    return obj;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e9e3,(PCWSTR)0x0);
}

Assistant:

Var AtomicsObject::ValidateSharedIntegerTypedArray(Var typedArray, ScriptContext *scriptContext, bool onlyInt32)
    {
        if (!VarIs<TypedArrayBase>(typedArray))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedTypedArrayObject);
        }

        TypeId typeId = JavascriptOperators::GetTypeId(typedArray);
        if (onlyInt32)
        {
            if (typeId != TypeIds_Int32Array)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidOperationOnTypedArray);
            }
        }
        else
        {
            if (!(typeId == TypeIds_Int8Array || typeId == TypeIds_Uint8Array || typeId == TypeIds_Int16Array ||
                typeId == TypeIds_Uint16Array || typeId == TypeIds_Int32Array || typeId == TypeIds_Uint32Array))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidOperationOnTypedArray);
            }
        }

        TypedArrayBase *typedArrayBase = UnsafeVarTo<TypedArrayBase>(typedArray);
        ArrayBufferBase* arrayBuffer = typedArrayBase->GetArrayBuffer();
        if (arrayBuffer == nullptr || !VarIsCorrectType(arrayBuffer) || !arrayBuffer->IsSharedArrayBuffer())
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedSharedArrayBufferObject);
        }

        return arrayBuffer;
    }